

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_comment<0>(xml_document<char> *this,char **text)

{
  char *pcVar1;
  undefined8 *puVar3;
  char *pcVar2;
  
  pcVar2 = *text;
  do {
    pcVar1 = pcVar2 + 1;
    if (*pcVar2 == '-') {
      if ((*pcVar1 == '-') && (pcVar2[2] == '>')) {
        *text = pcVar2 + 3;
        return (xml_node<char> *)0x0;
      }
    }
    else if (*pcVar2 == '\0') {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
      pcVar2 = *text;
      *puVar3 = &PTR__exception_00170498;
      puVar3[1] = "unexpected end of data";
      puVar3[2] = pcVar2;
      __cxa_throw(puVar3,&parse_error::typeinfo,std::exception::~exception);
    }
    *text = pcVar1;
    pcVar2 = pcVar1;
  } while( true );
}

Assistant:

xml_node<Ch> *parse_comment(Ch *&text)
        {
            // If parsing of comments is disabled
            if (!(Flags & parse_comment_nodes))
            {
                // Skip until end of comment
                while (text[0] != Ch('-') || text[1] != Ch('-') || text[2] != Ch('>'))
                {
                    if (!text[0])
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }
                text += 3;     // Skip '-->'
                return 0;      // Do not produce comment node
            }

            // Remember value start
            Ch *value = text;

            // Skip until end of comment
            while (text[0] != Ch('-') || text[1] != Ch('-') || text[2] != Ch('>'))
            {
                if (!text[0])
                    RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                ++text;
            }

            // Create comment node
            xml_node<Ch> *comment = this->allocate_node(node_comment);
            comment->value(value, text - value);
            
            // Place zero terminator after comment value
            if (!(Flags & parse_no_string_terminators))
                *text = Ch('\0');
            
            text += 3;     // Skip '-->'
            return comment;
        }